

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O3

MPP_RET hal_h264e_vepu541_gen_regs(void *hal,HalEncTask *task)

{
  MppBuffer *buffer;
  MppBufferGroup *group;
  undefined8 *puVar1;
  MppFrameFormat format;
  int iVar2;
  int *piVar3;
  long lVar4;
  EncRcTask *pEVar5;
  EncRcTask *pEVar6;
  MppDev pvVar7;
  MppPacket s;
  MppFrame frame;
  HalBufs bufs;
  MppEncROICfg *roi;
  short sVar8;
  Vepu541Fmt VVar9;
  byte bVar10;
  MPP_RET MVar11;
  uint uVar12;
  int iVar13;
  RK_U32 RVar14;
  RK_U32 RVar15;
  RK_U32 offset;
  RK_S32 RVar16;
  int iVar17;
  MppEncROICfg2 *cfg;
  VepuRgb2YuvCfg *pVVar18;
  MppBuffer pvVar19;
  undefined4 extraout_var;
  size_t sVar20;
  HalBuf *pHVar21;
  HalBuf *pHVar22;
  MppBufferGroup group_00;
  void *pvVar23;
  MppEncROIRegion *region;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  undefined4 uVar30;
  long lVar31;
  ulong uVar32;
  undefined4 uVar33;
  RK_U16 RVar34;
  int iVar35;
  RK_U32 *pRVar36;
  long lVar37;
  uint uVar38;
  RK_U32 *pRVar39;
  MppBuffer pvVar40;
  long lVar41;
  short sVar42;
  int iVar43;
  undefined8 uVar44;
  bool bVar45;
  byte bVar46;
  undefined8 uVar47;
  H264eRplmo rplmo;
  VepuFmtCfg local_80;
  long local_58;
  undefined8 local_50;
  void *local_48;
  MppFrameFormat local_3c;
  size_t local_38;
  
  bVar46 = 0;
  lVar41 = *hal;
  piVar3 = *(int **)((long)hal + 0x38);
  lVar37 = *(long *)((long)hal + 0x40);
  lVar4 = *(long *)((long)hal + 0x48);
  pEVar5 = task->rc_task;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_gen_regs");
  }
  local_48 = (void *)((long)hal + 0x1b8);
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","frame %d generate regs now","hal_h264e_vepu541_gen_regs");
  }
  RVar14 = hal_h264e_debug;
  memset(local_48,0,0x348);
  iVar29 = *(int *)((long)hal + 0x10);
  if ((RVar14 & 2) == 0) {
    uVar24 = 0x50100;
    uVar26 = 0xff;
    uVar27 = 0x8007000;
    bVar45 = true;
    uVar12 = 0;
    uVar38 = 0;
    uVar25 = 0;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_normal");
    uVar12 = *(uint *)((long)hal + 0x1f8);
    uVar24 = *(uint *)((long)hal + 0x1bc) & 0xfff8fc00 | 0x50100;
    uVar25 = *(uint *)((long)hal + 0x1c0) & 0xfffffffc;
    uVar38 = *(uint *)((long)hal + 0x1cc) & 0xfffffe00;
    uVar26 = *(uint *)((long)hal + 0x1c8) & 0xfffffe00 | 0xff;
    uVar27 = *(uint *)((long)hal + 500) & 0xf0000001 | 0x8007000;
    bVar45 = (hal_h264e_debug & 2) == 0;
  }
  *(uint *)((long)hal + 0x1bc) = uVar24;
  *(uint *)((long)hal + 0x1c0) = uVar25;
  *(undefined4 *)((long)hal + 0x1c4) = 0;
  *(uint *)((long)hal + 0x1c8) = uVar26;
  *(uint *)((long)hal + 0x1cc) = uVar38;
  *(undefined4 *)((long)hal + 0x1f0) = 0;
  *(uint *)((long)hal + 500) = uVar27;
  uVar24 = 0xff00ff7f;
  if (iVar29 == 0) {
    uVar24 = 0xffffff00;
  }
  *(uint *)((long)hal + 0x1f8) = uVar24 & uVar12 | 0x80;
  local_58 = lVar41;
  if (!bVar45) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_normal");
  }
  lVar41 = *hal;
  format = *(MppFrameFormat *)(lVar41 + 0x24);
  MVar11 = vepu541_set_fmt(&local_80,format);
  VVar9 = local_80.format;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_prep");
  }
  if (MVar11 != MPP_OK) {
    return MVar11;
  }
  uVar24 = (*(int *)(lVar41 + 0xc) + 0xfU >> 3 & 0x1fe) - 1 & 0x1ff;
  uVar12 = *(uint *)((long)hal + 0x1e8);
  *(uint *)((long)hal + 0x1e8) = uVar12 & 0xfffffe00 | uVar24;
  uVar25 = ((*(int *)(lVar41 + 0xc) + 0xfU & 0x30) - *(int *)(lVar41 + 0xc) & 0x3f) << 10;
  *(uint *)((long)hal + 0x1e8) = uVar12 & 0xffff0200 | uVar24 | uVar25;
  uVar26 = (*(int *)(lVar41 + 0x10) * 0x2000 + 0x1e000U & 0x1fe0000) + 0x1ff0000 & 0x1ff0000;
  *(uint *)((long)hal + 0x1e8) = uVar12 & 0xfe000200 | uVar24 | uVar25 | uVar26;
  *(uint *)((long)hal + 0x1e8) =
       uVar12 & 0x2000200 | uVar24 | uVar25 | uVar26 |
       ((*(int *)(lVar41 + 0x10) + 0xfU & 0x30) - *(int *)(lVar41 + 0x10)) * 0x4000000;
  *(uint *)((long)hal + 500) =
       *(uint *)((long)hal + 500) & 0xffffff0f | (local_80.src_endian & 0xf) << 4;
  *(Vepu541Fmt *)((long)hal + 0x1fc) =
       ((uint)(format == MPP_FMT_YUV400) * 0x80 +
        (VVar9 & (VEPU580_FMT_BUTT|VEPU541_FMT_BGR888)) * 4 |
        *(uint *)((long)hal + 0x1fc) & 0xffffff00 | local_80.alpha_swap & 1) +
       (local_80.rbuv_swap & 1) * 2 | (local_80.src_range & 1) << 6;
  if ((format & 0xf00000) == MPP_FMT_YUV420SP) {
    uVar12 = *(uint *)(lVar41 + 0x14);
    if (uVar12 == 0) {
      uVar12 = *(uint *)(lVar41 + 0xc);
    }
  }
  else {
    uVar12 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (uVar12 == 0) {
      uVar12 = *(int *)(lVar41 + 0x14) + 0xfU & 0xfffffff0;
    }
  }
  uVar24 = (int)uVar12 / 2;
  if ((VVar9 & ~VEPU541_FMT_BGR565) == VEPU541_FMT_YUV422SP) {
    uVar24 = uVar12;
  }
  if (VVar9 < VEPU541_FMT_NONE) {
    pVVar18 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar41 + 0x34),
                              *(MppFrameColorSpace *)(lVar41 + 0x28));
    bVar45 = true;
    if ((hal_h264e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","input color range %d colorspace %d","setup_vepu541_prep",
                 (ulong)*(uint *)(lVar41 + 0x34),(ulong)*(uint *)(lVar41 + 0x28));
      bVar45 = (hal_h264e_debug & 4) == 0;
    }
    uVar26 = (ushort)(pVVar18->_2y).b_coeff & 0x1ff;
    uVar25 = *(uint *)((long)hal + 0x200);
    *(uint *)((long)hal + 0x200) = uVar25 & 0xfffffe00 | uVar26;
    uVar38 = ((ushort)(pVVar18->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x200) = uVar25 & 0xfffc0000 | uVar26 | uVar38;
    *(uint *)((long)hal + 0x200) =
         uVar25 & 0xf8000000 | uVar26 | uVar38 | ((ushort)(pVVar18->_2y).r_coeff & 0x1ff) << 0x12;
    uVar26 = (ushort)(pVVar18->_2u).b_coeff & 0x1ff;
    uVar25 = *(uint *)((long)hal + 0x204);
    *(uint *)((long)hal + 0x204) = uVar25 & 0xfffffe00 | uVar26;
    uVar38 = ((ushort)(pVVar18->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x204) = uVar25 & 0xfffc0000 | uVar26 | uVar38;
    *(uint *)((long)hal + 0x204) =
         uVar25 & 0xf8000000 | uVar26 | uVar38 | ((ushort)(pVVar18->_2u).r_coeff & 0x1ff) << 0x12;
    uVar25 = *(uint *)((long)hal + 0x208);
    uVar26 = (ushort)(pVVar18->_2v).b_coeff & 0x1ff;
    *(uint *)((long)hal + 0x208) = uVar25 & 0xfffffe00 | uVar26;
    uVar38 = ((ushort)(pVVar18->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x208) = uVar25 & 0xfffc0000 | uVar26 | uVar38;
    *(uint *)((long)hal + 0x208) =
         uVar25 & 0xf8000000 | uVar26 | uVar38 | ((ushort)(pVVar18->_2v).r_coeff & 0x1ff) << 0x12;
    uVar25 = *(uint *)((long)hal + 0x20c);
    uVar26 = ((ushort)(pVVar18->_2y).offset & 0x1f) << 0x10;
    *(uint *)((long)hal + 0x20c) = uVar25 & 0xffe0ffff | uVar26;
    uVar25 = uVar25 & 0xffe000ff | uVar26 | ((ushort)(pVVar18->_2u).offset & 0xff) << 8;
    *(uint *)((long)hal + 0x20c) = uVar25;
    *(uint *)((long)hal + 0x20c) = CONCAT31((int3)(uVar25 >> 8),(char)(pVVar18->_2v).offset);
    if (!bVar45) {
      _mpp_log_l(4,"hal_h264e_vepu541","use color range %d colorspace %d","setup_vepu541_prep",
                 (ulong)pVVar18->dst_range,(ulong)pVVar18->color);
    }
  }
  else {
    uVar26 = *local_80.weight & 0x1ff;
    uVar25 = *(uint *)((long)hal + 0x200);
    *(uint *)((long)hal + 0x200) = uVar25 & 0xfffffe00 | uVar26;
    uVar38 = (local_80.weight[1] & 0x1ffU) << 9;
    *(uint *)((long)hal + 0x200) = uVar25 & 0xfffc0000 | uVar26 | uVar38;
    *(uint *)((long)hal + 0x200) =
         uVar25 & 0xf8000000 | uVar26 | uVar38 | (local_80.weight[2] & 0x1ffU) << 0x12;
    uVar26 = local_80.weight[3] & 0x1ff;
    uVar25 = *(uint *)((long)hal + 0x204);
    *(uint *)((long)hal + 0x204) = uVar25 & 0xfffffe00 | uVar26;
    uVar38 = (local_80.weight[4] & 0x1ffU) << 9;
    *(uint *)((long)hal + 0x204) = uVar25 & 0xfffc0000 | uVar26 | uVar38;
    *(uint *)((long)hal + 0x204) =
         uVar25 & 0xf8000000 | uVar26 | uVar38 | (local_80.weight[5] & 0x1ffU) << 0x12;
    uVar26 = local_80.weight[6] & 0x1ff;
    uVar25 = *(uint *)((long)hal + 0x208);
    *(uint *)((long)hal + 0x208) = uVar25 & 0xfffffe00 | uVar26;
    uVar38 = (local_80.weight[7] & 0x1ffU) << 9;
    *(uint *)((long)hal + 0x208) = uVar25 & 0xfffc0000 | uVar26 | uVar38;
    *(uint *)((long)hal + 0x208) =
         uVar25 & 0xf8000000 | uVar26 | uVar38 | (local_80.weight[8] & 0x1ffU) << 0x12;
    uVar26 = (*local_80.offset & 0x1fU) << 0x10;
    uVar25 = *(uint *)((long)hal + 0x20c);
    *(uint *)((long)hal + 0x20c) = uVar25 & 0xffe0ffff | uVar26;
    uVar25 = uVar25 & 0xffe000ff | uVar26 | (local_80.offset[1] & 0xffU) << 8;
    *(uint *)((long)hal + 0x20c) = uVar25;
    *(uint *)((long)hal + 0x20c) = CONCAT31((int3)(uVar25 >> 8),(char)local_80.offset[2]);
  }
  uVar25 = *(uint *)((long)hal + 0x210);
  uVar26 = (uint)((format & 0xf00000) != MPP_FMT_YUV420SP) << 0x1e;
  *(uint *)((long)hal + 0x210) = uVar25 & 0xbfffffff | uVar26;
  *(uint *)((long)hal + 0x2cc) = uVar24 << 0x10 | uVar12 & 0xffff;
  uVar12 = (uint)(0 < *(int *)(lVar41 + 0x58)) << 0x1a;
  *(uint *)((long)hal + 0x210) = uVar25 & 0xbbffffff | uVar26 | uVar12;
  *(uint *)((long)hal + 0x210) =
       (uVar25 & 0x83ffffff | uVar26 | uVar12) + (*(uint *)(lVar41 + 0x50) & 3) * 0x8000000 +
       0x20000000;
  *(byte *)((long)hal + 0x217) = *(byte *)((long)hal + 0x217) | 0x80;
  *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xe000e000;
  lVar41 = local_58;
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_prep"), lVar41 = local_58,
     (hal_h264e_debug & 2) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_codec");
  }
  uVar12 = *(uint *)((long)hal + 0x1ec);
  uVar24 = *(uint *)((long)hal + 0x354);
  *(uint *)((long)hal + 0x1ec) = uVar12 & 0xfffffffe;
  uVar12 = (uVar12 & 0xffffffea) + (uint)(0 < *(int *)(lVar4 + 0x20)) * 4 + 0x10;
  *(uint *)((long)hal + 0x1ec) = uVar12;
  *(uint *)((long)hal + 0x1ec) = uVar12 & 0x7f7fffde | (uint)(*(int *)(lVar4 + 0x2c) != 2) << 5;
  uVar12 = *(uint *)(lVar4 + 0x20) & 3;
  *(uint *)((long)hal + 0x354) = uVar24 & 0xfffffffc | uVar12;
  *(uint *)((long)hal + 0x354) =
       (uVar24 & 0xffffff80 | uVar12) + (*(uint *)(lVar4 + 0x24) & 0x1f) * 4;
  uVar12 = *(uint *)((long)hal + 0x358);
  uVar24 = piVar3[10] & 0xf;
  *(uint *)((long)hal + 0x358) = uVar12 & 0xfffffff0 | uVar24;
  uVar25 = (piVar3[0x12] & 1U) << 4;
  *(uint *)((long)hal + 0x358) = uVar12 & 0xffffffe0 | uVar24 | uVar25;
  *(uint *)((long)hal + 0x358) = uVar12 & 0xfffffe00 | uVar24 | uVar25 | (piVar3[0xc] & 0xfU) << 5;
  uVar12 = *(uint *)((long)hal + 0x35c);
  uVar24 = *(uint *)(lVar37 + 8) & 1;
  *(uint *)((long)hal + 0x35c) = uVar12 & 0xfffffffe | uVar24;
  uVar12 = (uVar12 & 0xfffffffc | uVar24) + (*(uint *)(lVar37 + 0x44) & 1) * 2;
  *(uint *)((long)hal + 0x35c) = uVar12;
  uVar12 = (uVar12 & 0xfffffffb) + (*(uint *)(lVar37 + 0x3c) & 1) * 4;
  *(uint *)((long)hal + 0x35c) = uVar12;
  uVar24 = *(int *)(lVar37 + 0x14) * 8 + 0x18U & 0x18;
  *(uint *)((long)hal + 0x35c) = uVar12 & 0xffffffe7 | uVar24;
  uVar25 = *(int *)(lVar37 + 0x18) * 0x20 + 0x60U & 0x60;
  *(uint *)((long)hal + 0x35c) = uVar12 & 0xffffff87 | uVar24 | uVar25;
  uVar26 = (*(uint *)(lVar37 + 0x24) & 0x3f) << 7;
  *(uint *)((long)hal + 0x35c) = uVar12 & 0xffffe007 | uVar24 | uVar25 | uVar26;
  uVar38 = (*(uint *)(lVar37 + 0x2c) & 0x1f) << 0xd;
  *(uint *)((long)hal + 0x35c) = uVar12 & 0xfffc0007 | uVar24 | uVar25 | uVar26 | uVar38;
  uVar27 = (*(uint *)(lVar37 + 0x34) & 0x1f) << 0x12;
  *(uint *)((long)hal + 0x35c) = uVar12 & 0xff800007 | uVar24 | uVar25 | uVar26 | uVar38 | uVar27;
  uVar28 = (*(uint *)(lVar37 + 0x1c) & 1) << 0x17;
  *(uint *)((long)hal + 0x35c) =
       uVar12 & 0xff000007 | uVar24 | uVar25 | uVar26 | uVar38 | uVar27 | uVar28;
  *(uint *)((long)hal + 0x35c) =
       uVar12 & 0xfe000007 | uVar24 | uVar25 | uVar26 | uVar38 | uVar27 | uVar28 |
       (*(uint *)(lVar37 + 0x38) & 1) << 0x18;
  uVar12 = (*(uint *)((long)hal + 0x360) & 0xfffffffc) + (uint)(*(int *)(lVar4 + 0x2c) == 2) * 2;
  *(uint *)((long)hal + 0x360) = uVar12;
  uVar12 = (uVar12 & 0xfffff802) + (*(uint *)(lVar4 + 0x30) & 0xff) * 4;
  *(uint *)((long)hal + 0x360) = uVar12;
  uVar24 = (*(uint *)(lVar4 + 0x38) & 1) << 0xb;
  *(uint *)((long)hal + 0x360) = uVar12 & 0xfffff3fe | uVar24;
  uVar25 = (*(uint *)(lVar4 + 0x40) & 3) << 0xc;
  *(uint *)((long)hal + 0x360) = uVar12 & 0xffffc3fe | uVar24 | uVar25;
  *(uint *)((long)hal + 0x360) = uVar12 & 0xc3fe | uVar24 | uVar25 | *(int *)(lVar4 + 0x34) << 0x10;
  uVar12 = 0xffff;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar12 = (uint)*(ushort *)(lVar4 + 0x6c);
  }
  *(short *)((long)hal + 0x364) = (short)uVar12;
  *(uint *)((long)hal + 0x364) = *(int *)(lVar4 + 0x74) << 0x10 | uVar12;
  uVar24 = (*(uint *)(lVar4 + 0x44) & 3) << 0xb;
  uVar12 = *(uint *)((long)hal + 0x368);
  *(uint *)((long)hal + 0x368) = uVar12 & 0xffffe7ff | uVar24;
  *(uint *)((long)hal + 0x368) = uVar12 & 0xffffe07f | uVar24 | (*(uint *)(lVar4 + 0x48) & 0xf) << 7
  ;
  h264e_reorder_rd_rewind(*(H264eReorderInfo **)(lVar4 + 0x58));
  MVar11 = h264e_reorder_rd_op(*(H264eReorderInfo **)(lVar4 + 0x58),(H264eRplmo *)&local_80);
  if (MVar11 == MPP_OK) {
    uVar12 = (local_80.format & VEPU541_FMT_NONE) + (*(uint *)((long)hal + 0x368) & 0xfffffff8) + 4;
    *(uint *)((long)hal + 0x368) = uVar12;
    RVar14 = local_80.alpha_swap;
    if ((local_80.format < VEPU541_FMT_BGR565) ||
       (RVar14 = local_80.rbuv_swap, local_80.format == VEPU541_FMT_BGR565)) {
      *(uint *)((long)hal + 0x368) = uVar12 & 0xffff | RVar14 << 0x10;
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu541","invalid modification_of_pic_nums_idc %d\n",
                 "setup_vepu541_codec");
    }
  }
  else {
    *(uint *)((long)hal + 0x368) = *(uint *)((long)hal + 0x368) & 0xfff8;
  }
  *(uint *)((long)hal + 0x36c) = *(uint *)((long)hal + 0x36c) & 0xe0000000;
  *(undefined4 *)((long)hal + 0x370) = 0;
  *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffff000;
  h264e_marking_rd_rewind(*(H264eMarkingInfo **)(lVar4 + 0x60));
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar12 = *(uint *)((long)hal + 0x36c);
    uVar24 = *(uint *)(lVar4 + 0x7c) & 1;
    *(uint *)((long)hal + 0x36c) = uVar12 & 0xfffffffe | uVar24;
    *(uint *)((long)hal + 0x36c) =
         (uVar12 & 0xfffffffc | uVar24) + (*(uint *)(lVar4 + 0x80) & 1) * 2;
  }
  else {
    RVar16 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
    if (RVar16 == 0) {
      *(byte *)((long)hal + 0x36c) = *(byte *)((long)hal + 0x36c) | 4;
      h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&local_80);
      uVar24 = 0;
      uVar12 = 0;
      RVar14 = local_80.alpha_swap;
      switch(local_80.format) {
      case VEPU541_FMT_BGR888:
        uVar25 = 0x10;
        break;
      case VEPU541_FMT_BGR565:
        uVar25 = 0x20;
        RVar14 = local_80.rbuv_swap;
        break;
      case VEPU541_FMT_NONE:
        uVar12 = local_80.src_range & 0xf;
        uVar25 = 0x30;
        break;
      case VEPU541_FMT_YUV422SP:
        uVar25 = 0x40;
        uVar12 = uVar24;
        RVar14 = local_80.src_endian;
        break;
      case VEPU541_FMT_YUV422P:
        uVar25 = 0x50;
        RVar14 = 0;
        uVar12 = uVar24;
        break;
      case VEPU541_FMT_YUV420SP:
        uVar25 = 0x60;
        uVar12 = uVar24;
        RVar14 = local_80.src_range;
        break;
      default:
        uVar25 = 0;
        _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
        uVar12 = 0;
        RVar14 = 0;
      }
      *(RK_U32 *)((long)hal + 0x36c) =
           (RVar14 & 0xffff) << 7 | uVar25 | *(uint *)((long)hal + 0x36c) & 0xff80000f;
      *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffffff0 | uVar12;
      RVar16 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
      if (RVar16 == 0) {
        h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&local_80);
        uVar24 = 0;
        uVar12 = 0;
        switch(local_80.format) {
        case VEPU541_FMT_BGR888:
          uVar25 = local_80.alpha_swap & 0xffff;
          uVar33 = 0x800000;
          break;
        case VEPU541_FMT_BGR565:
          uVar25 = local_80.rbuv_swap & 0xffff;
          uVar33 = 0x1000000;
          break;
        case VEPU541_FMT_NONE:
          uVar25 = local_80.alpha_swap & 0xffff;
          uVar12 = (local_80.src_range & 0xf) << 4;
          uVar33 = 0x1800000;
          break;
        case VEPU541_FMT_YUV422SP:
          uVar25 = local_80.src_endian & 0xffff;
          uVar33 = 0x2000000;
          uVar12 = uVar24;
          break;
        case VEPU541_FMT_YUV422P:
          uVar33 = 0x2800000;
          uVar25 = 0;
          uVar12 = uVar24;
          break;
        case VEPU541_FMT_YUV420SP:
          uVar25 = local_80.src_range & 0xffff;
          uVar33 = 0x3000000;
          uVar12 = uVar24;
          break;
        default:
          uVar33 = 0;
          _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
          uVar25 = 0;
          uVar12 = 0;
        }
        *(ulong *)((long)hal + 0x36c) =
             CONCAT44(uVar25,uVar33) | *(ulong *)((long)hal + 0x36c) & (ulong)DAT_002acb40;
        *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xffffff0f | uVar12;
        RVar16 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
        if (RVar16 == 0) {
          h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&local_80);
          uVar24 = 0;
          uVar12 = 0;
          switch(local_80.format) {
          case VEPU541_FMT_BGR888:
            uVar33 = 0x4000000;
            local_80.src_range = local_80.alpha_swap;
            break;
          case VEPU541_FMT_BGR565:
            uVar33 = 0x8000000;
            local_80.src_range = local_80.rbuv_swap;
            break;
          case VEPU541_FMT_NONE:
            uVar12 = (local_80.src_range & 0xf) << 8;
            uVar33 = 0xc000000;
            local_80.src_range = local_80.alpha_swap;
            break;
          case VEPU541_FMT_YUV422SP:
            uVar33 = 0x10000000;
            uVar12 = uVar24;
            local_80.src_range = local_80.src_endian;
            break;
          case VEPU541_FMT_YUV422P:
            uVar33 = 0x14000000;
            local_80.src_range = 0;
            uVar12 = uVar24;
            break;
          case VEPU541_FMT_YUV420SP:
            uVar33 = 0x18000000;
            uVar12 = uVar24;
            break;
          default:
            uVar33 = 0;
            _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
            local_80.src_range = 0;
            uVar12 = 0;
          }
          *(ulong *)((long)hal + 0x36c) =
               CONCAT44(local_80.src_range << 0x10,uVar33) |
               *(ulong *)((long)hal + 0x36c) & (ulong)DAT_002acb50;
          *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffff0ff | uVar12;
        }
      }
    }
  }
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_codec"), (hal_h264e_debug & 2) != 0)
     ) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_rdo_pred");
  }
  bVar10 = *(byte *)((long)hal + 0x21c) & 0xf8;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    *(byte *)((long)hal + 0x21c) = bVar10;
LAB_0021ca8a:
    pRVar36 = h264e_klut_weight;
  }
  else {
    *(byte *)((long)hal + 0x21c) = bVar10 | 3;
    if (*(int *)(lVar41 + 0x1864) != 1) goto LAB_0021ca8a;
    pRVar36 = h264e_klut_weight + 3;
  }
  pRVar39 = (RK_U32 *)((long)hal + 0x220);
  for (lVar31 = 0x18; lVar31 != 0; lVar31 = lVar31 + -1) {
    *pRVar39 = *pRVar36;
    pRVar36 = pRVar36 + (ulong)bVar46 * -2 + 1;
    pRVar39 = pRVar39 + (ulong)bVar46 * -2 + 1;
  }
  bVar45 = *(int *)(lVar41 + 0x1864) == 1;
  uVar12 = 0x9c509c5;
  if (bVar45) {
    uVar12 = 0x3f0009;
  }
  uVar24 = 2;
  if (bVar45) {
    uVar24 = 0x80300;
  }
  *(uint *)((long)hal + 0x34c) = uVar12 | *(uint *)((long)hal + 0x34c) & 0xf000f000;
  uVar12 = *(uint *)((long)hal + 0x350);
  *(uint *)((long)hal + 0x350) = uVar12 & 0xfff7e01d | uVar24;
  iVar29 = 0;
  uVar25 = 0;
  if (*piVar3 == 0x42) {
    uVar25 = (uint)(piVar3[7] < 0x1f);
  }
  *(uint *)((long)hal + 0x350) = uVar12 & 0xfff7e01c | uVar24 | uVar25;
  if (*piVar3 < 0x4d) {
    iVar29 = (uint)(*(int *)(lVar37 + 8) == 0) << 3;
  }
  uVar12 = (uVar12 & 0xfff7c004 | uVar24 | uVar25) + iVar29 + 0x2010;
  *(uint *)((long)hal + 0x350) = uVar12;
  uVar24 = (*(uint *)(lVar37 + 0x48) & 1) << 0xe;
  *(uint *)((long)hal + 0x350) = uVar12 & 0xffffa31f | uVar24;
  *(uint *)((long)hal + 0x350) =
       (uVar12 & 0x7fc8231f | uVar24) + (*(uint *)(lVar37 + 0x48) & 3) * 0x100000 + 0x8000;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_rdo_pred");
  }
  pEVar6 = task->rc_task;
  iVar29 = piVar3[0xf];
  uVar12 = (pEVar6->info).bit_target;
  uVar24 = (pEVar6->info).quality_target;
  uVar25 = (pEVar6->info).quality_min;
  uVar26 = (pEVar6->info).quality_max;
  iVar43 = (int)(uVar12 << 4) / (piVar3[0x10] * iVar29);
  if ((hal_h264e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","bittarget %d qp [%d %d %d]\n","setup_vepu541_rc_base",
               (ulong)uVar12,(ulong)uVar25,uVar24,uVar26);
  }
  iVar35 = 0x50000;
  if (iVar43 < 0x100000) {
    iVar35 = iVar43;
  }
  iVar13 = iVar35 * iVar29 >> 4;
  iVar43 = iVar13 * 5;
  iVar13 = iVar13 * 5 + 0xf;
  if (-1 < iVar43) {
    iVar13 = iVar43;
  }
  iVar13 = iVar13 >> 4;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_rc_base");
  }
  *(uint *)((long)hal + 0x1ec) = *(uint *)((long)hal + 0x1ec) & 0xffffc0ff | (uVar24 & 0x3f) << 8;
  *(uint *)((long)hal + 0x280) = (*(uint *)((long)hal + 0x280) & 0xfff8) + iVar29 * 0x10000 + 3;
  uVar26 = uVar26 & 0x3f;
  uVar12 = uVar25 & 0x3f;
  *(uint *)((long)hal + 0x284) =
       uVar25 << 0x1a |
       uVar26 << 0x14 |
       (*(uint *)(local_58 + 0x17c + (ulong)(*(int *)(lVar4 + 0x2c) == 2) * 4) & 0xf) << 0x10 |
       (uint)*(ushort *)((long)hal + 0x284);
  *(ulong *)((long)hal + 0x288) =
       CONCAT44(0x2083fe,iVar35) & 0xffffffff000fffff |
       *(ulong *)((long)hal + 0x288) & 0xfe000000fff00000;
  *(uint *)((long)hal + 0x290) = *(uint *)((long)hal + 0x290) & 0xfff00000;
  *(int *)((long)hal + 0x294) = iVar13 * -2;
  *(int *)((long)hal + 0x298) = -iVar13;
  *(int *)((long)hal + 0x29c) = iVar13;
  *(int *)((long)hal + 0x2a0) = iVar13 * 2;
  *(undefined8 *)((long)hal + 0x2a4) = 0x7fffffff7fffffff;
  *(undefined8 *)((long)hal + 0x2ac) = 0x7fffffff7fffffff;
  *(undefined4 *)((long)hal + 0x2b4) = 0x7fffffff;
  *(uint *)((long)hal + 0x2b8) =
       *(uint *)((long)hal + 0x2b8) & 0xc0000000 | uVar12 | uVar12 << 0xc | uVar12 << 0x18 |
       uVar26 << 6 | uVar26 << 0x12;
  *(uint *)((long)hal + 700) =
       uVar26 << 0x18 |
       uVar12 << 0x12 | uVar26 << 0xc | uVar12 << 6 | *(uint *)((long)hal + 700) & 0xc0000000 |
       uVar26;
  *(uint *)((long)hal + 0x2c0) =
       *(uint *)((long)hal + 0x2c0) & 0xc0000000 | uVar12 | uVar12 << 0xc | uVar12 << 0x18 |
       uVar26 << 6 | uVar26 << 0x12;
  *(uint *)((long)hal + 0x2c4) = (*(uint *)((long)hal + 0x2c4) & 0x3fffffc0) + uVar26 + 0x40000000;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_rc_base");
  }
  pvVar7 = *(MppDev *)((long)hal + 8);
  s = task->packet;
  frame = task->frame;
  pvVar19 = mpp_frame_get_buffer(frame);
  pvVar40 = task->output;
  local_3c = mpp_frame_get_fmt(frame);
  RVar14 = mpp_frame_get_hor_stride(frame);
  RVar15 = mpp_frame_get_ver_stride(frame);
  local_50 = CONCAT44(extraout_var,RVar15);
  iVar29 = mpp_buffer_get_fd_with_caller(pvVar19,"setup_vepu541_io_buf");
  sVar20 = mpp_packet_get_length(s);
  local_38 = mpp_buffer_get_size_with_caller(pvVar40,"setup_vepu541_io_buf");
  iVar43 = mpp_buffer_get_fd_with_caller(pvVar40,"setup_vepu541_io_buf");
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_io_buf");
  }
  *(int *)((long)hal + 0x2d0) = iVar29;
  *(int *)((long)hal + 0x2d4) = iVar29;
  *(int *)((long)hal + 0x2d8) = iVar29;
  *(int *)((long)hal + 0x304) = iVar43;
  *(int *)((long)hal + 0x308) = iVar43;
  *(int *)((long)hal + 0x30c) = iVar43;
  *(int *)((long)hal + 0x310) = iVar43;
  if ((local_3c & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(frame);
    RVar15 = 0;
    goto LAB_0021cfe0;
  }
  offset = 0;
  RVar15 = 0;
  if (MPP_FMT_AYUV1BPP < (local_3c & 0xfffc) || (local_3c & 0xf0000) != MPP_FMT_YUV420SP)
  goto LAB_0021cfe0;
  vepu541_set_fmt(&local_80,local_3c);
  iVar29 = (int)local_50;
  switch(local_80.format) {
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV420SP:
    offset = iVar29 * RVar14;
    RVar15 = offset;
    break;
  case VEPU541_FMT_YUV422P:
    RVar15 = (int)(iVar29 * RVar14 * 3) / 2;
    goto LAB_0021cfd7;
  case VEPU541_FMT_YUV420P:
    iVar43 = iVar29 * RVar14 * 5;
    iVar35 = iVar29 * RVar14 * 5 + 3;
    if (-1 < iVar43) {
      iVar35 = iVar43;
    }
    RVar15 = iVar35 >> 2;
LAB_0021cfd7:
    offset = iVar29 * RVar14;
    break;
  default:
    offset = 0;
    RVar15 = 0;
  }
LAB_0021cfe0:
  mpp_dev_set_reg_offset(pvVar7,0x47,offset);
  mpp_dev_set_reg_offset(pvVar7,0x48,RVar15);
  mpp_dev_set_reg_offset(pvVar7,0x53,(RK_U32)local_38);
  mpp_dev_set_reg_offset(pvVar7,0x56,(RK_U32)sVar20);
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_io_buf"), (hal_h264e_debug & 2) != 0
     )) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_roi");
  }
  if (*(undefined8 **)((long)hal + 0x160) == (undefined8 *)0x0) {
    pvVar40 = *(MppBuffer *)((long)hal + 0x180);
    if (pvVar40 != (MppBuffer)0x0) {
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      goto LAB_0021d0a8;
    }
    roi = *(MppEncROICfg **)((long)hal + 0x158);
    if (((roi == (MppEncROICfg *)0x0) || (roi->number == 0)) ||
       (roi->regions == (MppEncROIRegion *)0x0)) {
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) & 0xfd;
      *(undefined4 *)((long)hal + 0x2dc) = 0;
    }
    else {
      iVar29 = *(int *)(*(long *)((long)hal + 0x38) + 0x3c) << 4;
      iVar43 = *(int *)(*(long *)((long)hal + 0x38) + 0x40) << 4;
      RVar16 = vepu541_get_roi_buf_size(iVar29,iVar43);
      pvVar40 = *(MppBuffer *)((long)hal + 0x170);
      if ((pvVar40 == (MppBuffer)0x0) || (RVar16 != *(int *)((long)hal + 0x178))) {
        buffer = (MppBuffer *)((long)hal + 0x170);
        group = (MppBufferGroup *)((long)hal + 0x168);
        group_00 = *(MppBufferGroup *)((long)hal + 0x168);
        if (group_00 == (MppBufferGroup)0x0) {
          mpp_buffer_group_get
                    (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h264e_vepu541",
                     "setup_vepu541_roi");
        }
        else if (RVar16 != *(int *)((long)hal + 0x178)) {
          if (pvVar40 != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(pvVar40,"setup_vepu541_roi");
            *buffer = (MppBuffer)0x0;
            group_00 = *group;
          }
          mpp_buffer_group_clear(group_00);
        }
        if ((*group == (MppBufferGroup)0x0) &&
           (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx->roi_grp","setup_vepu541_roi",0x44e), (mpp_debug._3_1_ & 0x10) != 0))
        goto LAB_0021e2c3;
        pvVar40 = *buffer;
        if (pvVar40 == (MppBuffer)0x0) {
          mpp_buffer_get_with_tag
                    (*(MppBufferGroup *)((long)hal + 0x168),buffer,(long)RVar16,"hal_h264e_vepu541",
                     "setup_vepu541_roi");
          pvVar40 = *(MppBuffer *)((long)hal + 0x170);
          *(RK_S32 *)((long)hal + 0x178) = RVar16;
          if (pvVar40 == (MppBuffer)0x0) {
            _mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx->roi_buf","setup_vepu541_roi",0x456);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0021e2c3;
            pvVar40 = *buffer;
          }
        }
        else {
          *(RK_S32 *)((long)hal + 0x178) = RVar16;
        }
      }
      iVar35 = mpp_buffer_get_fd_with_caller(pvVar40,"setup_vepu541_roi");
      pvVar23 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_roi");
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      *(int *)((long)hal + 0x2dc) = iVar35;
      vepu541_set_roi(pvVar23,roi,iVar29,iVar43);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x170),0,"setup_vepu541_roi");
    }
  }
  else {
    *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
    pvVar40 = (MppBuffer)**(undefined8 **)((long)hal + 0x160);
LAB_0021d0a8:
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar40,"setup_vepu541_roi");
    *(int *)((long)hal + 0x2dc) = iVar29;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_roi");
  }
  pvVar7 = *(MppDev *)((long)hal + 8);
  bufs = *(HalBufs *)((long)hal + 0x18);
  lVar41 = *(long *)((long)hal + 0x50);
  RVar14 = *(RK_U32 *)((long)hal + 0x20);
  pHVar21 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar41 + 4));
  pHVar22 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar41 + 8));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_recn_refr");
  }
  if ((pHVar21 != (HalBuf *)0x0) && (pHVar21->cnt != 0)) {
    pvVar40 = *pHVar21->buf;
    pvVar19 = pHVar21->buf[1];
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar40,"setup_vepu541_recn_refr");
    if (((pvVar40 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu541_recn_refr",0x476), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar19 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu541_recn_refr",0x477), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_0021e2c3;
    *(int *)((long)hal + 0x2e0) = iVar29;
    *(int *)((long)hal + 0x2e4) = iVar29;
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar19,"setup_vepu541_recn_refr");
    *(int *)((long)hal + 0x2f8) = iVar29;
    mpp_dev_set_reg_offset(pvVar7,0x4b,RVar14);
  }
  if ((pHVar22 != (HalBuf *)0x0) && (pHVar22->cnt != 0)) {
    pvVar40 = *pHVar22->buf;
    pvVar19 = pHVar22->buf[1];
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar40,"setup_vepu541_recn_refr");
    if (((pvVar40 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu541_recn_refr",0x485), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar19 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu541_recn_refr",0x486), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_0021e2c3;
    *(int *)((long)hal + 0x2e8) = iVar29;
    *(int *)((long)hal + 0x2ec) = iVar29;
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar19,"setup_vepu541_recn_refr");
    *(int *)((long)hal + 0x2fc) = iVar29;
    mpp_dev_set_reg_offset(pvVar7,0x4d,RVar14);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_recn_refr");
  }
  lVar41 = local_58;
  if (task->md_info == (MppBuffer)0x0) {
    iVar29 = 0;
  }
  else {
    iVar29 = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu541_gen_regs");
  }
  *(int *)((long)hal + 0x300) = iVar29;
  RVar14 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xffffe000 | RVar14 & 0x1fff;
  RVar14 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)hal + 0x2c8) =
       *(uint *)((long)hal + 0x2c8) & 0xe000ffff | (RVar14 & 0x1fff) << 0x10;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_split");
  }
  iVar29 = *(int *)(lVar41 + 0xe94);
  if (iVar29 == 2) {
    uVar12 = *(uint *)((long)hal + 0x314);
    *(uint *)((long)hal + 0x314) = uVar12 & 0xffffc000 | 0x2fa3;
    *(uint *)((long)hal + 0x314) =
         (uVar12 & 0xc000 | 0x2fa3) + *(int *)(lVar41 + 0xe98) * 0x10000 + -0x10000;
    *(uint *)((long)hal + 0x318) = *(uint *)((long)hal + 0x318) & 0xfffc0000;
LAB_0021d498:
    *(byte *)((long)hal + 0x1ef) = *(byte *)((long)hal + 0x1ef) & 0xbf;
  }
  else {
    if (iVar29 == 1) {
      *(uint *)((long)hal + 0x314) = *(uint *)((long)hal + 0x314) & 0xc000 | 0x2fa1;
      *(uint *)((long)hal + 0x318) =
           *(uint *)((long)hal + 0x318) & 0xfffc0000 | *(uint *)(lVar41 + 0xe98) & 0x3ffff;
      goto LAB_0021d498;
    }
    if (iVar29 == 0) {
      *(ulong *)((long)hal + 0x314) = *(ulong *)((long)hal + 0x314) & 0xfffc00000000c000;
      goto LAB_0021d498;
    }
    _mpp_log_l(4,"hal_h264e_vepu541","invalide slice split mode %d\n","setup_vepu541_split");
  }
  *(undefined4 *)(lVar41 + 0xe90) = 0;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_split");
  }
  if (*(int *)((long)hal + 0x10) == 0) {
    bVar45 = true;
  }
  else {
    iVar29 = *(int *)(lVar41 + 0xc);
    if (0x780 < iVar29) {
      bVar45 = true;
      if ((hal_h264e_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu540_force_slice_split");
        bVar45 = (hal_h264e_debug & 2) == 0;
      }
      *(uint *)((long)hal + 0x314) =
           (*(uint *)((long)hal + 0x314) & 0xc000) + (iVar29 * 0x1000 - 0x1000U & 0xffff0000) +
           0x2fa3;
      *(uint *)((long)hal + 0x318) = *(uint *)((long)hal + 0x318) & 0xfffc0000;
      *(byte *)((long)hal + 0x1ef) = *(byte *)((long)hal + 0x1ef) & 0xbf;
      *(byte *)((long)hal + 0x217) = *(byte *)((long)hal + 0x217) & 0x7f;
      if (!bVar45) {
        _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu540_force_slice_split");
      }
    }
    bVar45 = *(int *)((long)hal + 0x10) == 0;
  }
  iVar43 = piVar3[7];
  iVar35 = piVar3[0xf];
  iVar29 = iVar35 * 0x10 + 0x3f;
  iVar13 = iVar35 * 0x10 + 0x7e;
  if (-1 < iVar29) {
    iVar13 = iVar29;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_me");
  }
  uVar12 = 0xc;
  if (iVar43 < 0x14) {
    if ((iVar43 - 0xbU < 3) || (iVar43 != 10)) {
LAB_0021d62a:
      uVar12 = 0x1c;
    }
  }
  else if (iVar43 != 99) goto LAB_0021d62a;
  uVar24 = piVar3[0xf] * 2 + 1;
  uVar25 = 0xb;
  if ((int)uVar24 < 0x2c) {
    uVar25 = piVar3[0xf] * 2 + 4;
    if (-1 < (int)uVar24) {
      uVar25 = uVar24;
    }
    uVar25 = uVar25 >> 2 & 0xf;
  }
  iVar13 = iVar13 >> 6;
  uVar26 = uVar12 >> 2;
  uVar38 = piVar3[0x10] * 0x10 + 0x3fU & 0xffffffc0;
  uVar24 = uVar38 + 0x7f;
  if (-1 < (int)uVar38) {
    uVar24 = uVar38;
  }
  iVar29 = (int)uVar24 >> 7;
  uVar24 = iVar29 << 4;
  if (uVar26 == iVar29 * 4 || SBORROW4(uVar26,iVar29 * 4) != (int)(uVar26 + iVar29 * -4) < 0) {
    uVar24 = uVar12;
  }
  uVar24 = uVar24 << 2;
  *(uint *)((long)hal + 0x31c) =
       uVar25 + (uVar24 & 0xf0 | *(uint *)((long)hal + 0x31c) & 0xc000) + 0x2f00;
  uVar12 = *(uint *)((long)hal + 800) | 0x505;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar12 = *(uint *)((long)hal + 800) & 0xfff00000;
  }
  *(uint *)((long)hal + 800) = uVar12 & 0xfff00505 | 0xa0000;
  if (bVar45) {
    if (iVar35 < 0xe1) {
      if (iVar35 < 0xc5) {
        if (iVar35 < 0xb1) {
          if (iVar35 < 0xa1) {
            if (iVar35 < 0x95) {
              if (iVar35 < 0x89) {
                if (iVar35 < 0x81) {
                  if (iVar35 < 0x75) {
                    uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff;
                    if (iVar35 < 0x71) {
                      uVar12 = uVar12 | 0x8800;
                    }
                    else {
                      uVar12 = uVar12 | 0x8000;
                    }
                  }
                  else {
                    uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x7800;
                  }
                }
                else {
                  uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x7000;
                }
              }
              else {
                uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x6800;
              }
            }
            else {
              uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x6000;
            }
          }
          else {
            uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x5800;
          }
        }
        else {
          uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x5000;
        }
      }
      else {
        uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x4800;
      }
    }
    else {
      uVar12 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x4000;
    }
    uVar26 = uVar24 >> 3 & 0x1e;
    uVar24 = uVar25 * 4 + 0xf >> 3 | 1;
    uVar25 = uVar12 >> 0xb & 0x1f;
    if (uVar26 + 1 < uVar25) {
      uVar12 = uVar12 & 0xfffff800 | uVar26 * iVar13 + uVar24 & 0x7ff;
    }
    else {
      uVar12 = uVar12 & 0xfffff800 | (uVar25 - 1) * iVar13 + uVar24 & 0x7ff;
    }
    *(uint *)((long)hal + 0x324) = uVar12;
  }
  else {
    uVar38 = (*(uint *)((long)hal + 0x1e8) & 0x1ff) * 8 + 0x47 >> 6;
    iVar43 = uVar38 * -4 + 0x1f8;
    iVar29 = uVar38 * 4 + -0x1c;
    uVar12 = 0;
    uVar26 = 0x1dc;
    do {
      uVar27 = uVar12;
      uVar12 = uVar27 + 1;
      iVar43 = iVar43 + iVar29;
      if (0x10 < uVar12) break;
      bVar45 = uVar26 < 0x510;
      uVar26 = uVar26 + iVar29;
    } while (bVar45);
    if (iVar43 < 0x511) {
      uVar27 = uVar12;
    }
    uVar25 = uVar25 + 3 >> 1 | 1;
    uVar24 = uVar24 >> 3 & 0x1e;
    uVar12 = uVar24 + 1;
    if (uVar27 <= uVar24) {
      uVar12 = uVar27;
    }
    uVar24 = iVar13 * 2;
    if ((int)uVar25 <= iVar13) {
      uVar24 = uVar25;
    }
    *(uint *)((long)hal + 0x324) =
         (uVar12 - 1) * iVar13 + uVar24 & 0x7ff |
         (uVar27 & 0x1f) << 0xb | uVar38 << 0x12 | *(uint *)((long)hal + 0x324) & 0xfc030000;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_me");
  }
  uVar32 = (pEVar5->frm).val;
  if ((uVar32 >> 0x26 & 1) != 0) {
    lVar37 = (long)(uVar32 >> 0x30) % (long)*(int *)(lVar41 + 0xc4);
    iVar43 = (int)lVar37;
    lVar41 = *hal;
    uVar12 = *(uint *)(*(long *)((long)hal + 0x38) + 0x3c);
    uVar24 = *(uint *)(*(long *)((long)hal + 0x38) + 0x40);
    iVar29 = *(int *)(lVar41 + 0x16c);
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_intra_refresh");
      lVar41 = *hal;
    }
    if (*(int *)(lVar41 + 0x164) == 0) {
      uVar44 = 0xfffffffa;
    }
    else {
      iVar13 = uVar12 << 4;
      iVar35 = uVar24 << 4;
      RVar16 = vepu541_get_roi_buf_size(iVar13,iVar35);
      if (*(int *)((long)hal + 0x178) < RVar16) {
        if (*(long *)((long)hal + 0x168) == 0) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)((long)hal + 0x168),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_h264e_vepu541","setup_vepu541_intra_refresh");
        }
        if (*(MppBuffer *)((long)hal + 0x170) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller
                    (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
        }
        mpp_buffer_get_with_tag
                  (*(MppBufferGroup *)((long)hal + 0x168),(MppBuffer *)((long)hal + 0x170),
                   (long)RVar16,"hal_h264e_vepu541","setup_vepu541_intra_refresh");
        *(RK_S32 *)((long)hal + 0x178) = RVar16;
      }
      pvVar40 = *(MppBuffer *)((long)hal + 0x170);
      if (pvVar40 == (MppBuffer)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->roi_buf"
                   ,"setup_vepu541_intra_refresh",0x3ed);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0021e2c3:
          abort();
        }
        pvVar40 = *(MppBuffer *)((long)hal + 0x170);
      }
      uVar12 = ((uVar24 & 0xfffffff) + 3 & 0xfffffffc) * ((uVar12 & 0xfffffff) + 3 & 0xfffffffc);
      iVar17 = mpp_buffer_get_fd_with_caller(pvVar40,"setup_vepu541_intra_refresh");
      pvVar23 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
      if (uVar12 != 0) {
        uVar32 = 0;
        do {
          puVar1 = (undefined8 *)((long)pvVar23 + uVar32 * 2);
          *puVar1 = 0x80008000800080;
          puVar1[1] = 0x80008000800080;
          uVar32 = uVar32 + 8;
        } while (uVar12 != uVar32);
      }
      region = (MppEncROIRegion *)mpp_osal_calloc("setup_vepu541_intra_refresh",0x10);
      uVar44 = 0;
      if (region == (MppEncROIRegion *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu541","Failed to calloc for MppEncROIRegion !\n",
                   "setup_vepu541_intra_refresh");
        uVar44 = 0xfffffffc;
      }
      lVar41 = *hal;
      iVar2 = *(int *)(lVar41 + 0x168);
      sVar42 = (short)lVar37;
      sVar8 = (short)iVar29;
      if (iVar2 == 1) {
        region->y = 0;
        region->h = (RK_U16)iVar35;
        if (iVar43 == 0) {
          sVar42 = (short)(iVar29 << 4);
          RVar34 = 0;
        }
        else {
          RVar34 = sVar42 * sVar8 * 0x10 - 0x20;
          sVar42 = sVar8 * 0x10 + 0x20;
        }
        region->x = RVar34;
        uVar24 = 1;
        uVar12 = 0xfffffff0;
        lVar37 = 4;
LAB_0021ddfd:
        *(short *)((long)&region->x + lVar37) = sVar42;
        *(uint *)((long)hal + 0x31c) = uVar12 & *(uint *)((long)hal + 0x31c) | uVar24;
      }
      else if (iVar2 == 0) {
        region->x = 0;
        region->w = (RK_U16)iVar13;
        if (iVar43 == 0) {
          sVar42 = (short)(iVar29 << 4);
          RVar34 = 0;
        }
        else {
          RVar34 = sVar42 * sVar8 * 0x10 - 0x20;
          sVar42 = sVar8 * 0x10 + 0x20;
        }
        region->y = RVar34;
        uVar24 = 0x10;
        uVar12 = 0xffffff0f;
        lVar37 = 6;
        goto LAB_0021ddfd;
      }
      region->intra = 1;
      region->quality = -*(short *)(lVar41 + 0x124);
      region->qp_area_idx = 1;
      region->area_map_en = '\x01';
      region->abs_qp_en = '\0';
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      *(int *)((long)hal + 0x2dc) = iVar17;
      vepu541_set_one_roi(pvVar23,region,iVar13,iVar35);
      mpp_osal_free("setup_vepu541_intra_refresh",region);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x170),0,"setup_vepu541_intra_refresh");
    }
    lVar41 = local_58;
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","leave, ret %d\n","setup_vepu541_intra_refresh",uVar44);
    }
  }
  if (*(int *)((long)hal + 0x10) == 0) {
    vepu541_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
  }
  else {
    vepu540_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_l2");
  }
  memset((void *)((long)hal + 0x518),0,0x2f4);
  *(undefined8 *)((long)hal + 0x500) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x508) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x510) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x51c) = 0x30283c3030283c30;
  *(undefined8 *)((long)hal + 0x524) = 0x201c2a2430283c30;
  if (*(int *)(lVar41 + 0x1864) == 1) {
    *(undefined4 *)((long)hal + 0x518) = 0;
    *(undefined4 *)((long)hal + 0x800) = 3;
    if (*(int *)(lVar4 + 0x2c) != 2) {
      uVar44 = 0x171b1c00000051;
      uVar47 = 0x171b1c00202020;
LAB_0021dfa5:
      *(undefined8 *)((long)hal + 0x534) = uVar44;
      *(undefined8 *)((long)hal + 0x53c) = uVar47;
      uVar30 = 0x2ae47;
      uVar33 = 0x2d0051;
      goto LAB_0021dfb6;
    }
    uVar44 = 0x10121400202020;
  }
  else {
    *(undefined4 *)((long)hal + 0x518) = 0x9c5;
    *(undefined4 *)((long)hal + 0x800) = 0;
    if (*(int *)(lVar4 + 0x2c) != 2) {
      *(undefined4 *)((long)hal + 0x52c) = 0x247;
      uVar44 = 0x10111200000051;
      uVar47 = 0x10111200141414;
      goto LAB_0021dfa5;
    }
    uVar44 = 0x10121400141414;
  }
  *(undefined8 *)((long)hal + 0x534) = 0x10101000000024;
  *(undefined8 *)((long)hal + 0x53c) = uVar44;
  uVar30 = 0x2aeab;
  uVar33 = 0x2d0024;
LAB_0021dfb6:
  *(undefined4 *)((long)hal + 0x52c) = uVar30;
  if (*(int *)(lVar41 + 0x18c) != 0) {
    uVar12 = *(uint *)(lVar41 + 0x184) & 0x3ff;
    *(uint *)((long)hal + 0x52c) = uVar12 + 0x2ac00;
    *(uint *)((long)hal + 0x52c) = (*(uint *)(lVar41 + 0x188) & 0x3ff) << 10 | uVar12;
  }
  *(undefined4 *)((long)hal + 0x530) = 0x40001;
  *(undefined4 *)((long)hal + 0x534) = uVar33;
  *(undefined8 *)((long)hal + 0x544) = 0x9c4009000400000;
  *(undefined8 *)((long)hal + 0x54c) = 0xc0009001180050;
  *(undefined8 *)((long)hal + 0x554) = 0x1600130018001a;
  *(undefined8 *)((long)hal + 0x55c) = 0xdac0dac00130013;
  *(undefined8 *)((long)hal + 0x564) = 0x3e80dac0000;
  *(undefined4 *)((long)hal + 0x56c) = 0;
  *(undefined4 *)((long)hal + 0x638) = 0;
  memcpy((void *)((long)hal + 0x63c),h264e_lambda_default + 6,0xd0);
  memcpy((void *)((long)hal + 0x70c),h264e_lambda_default + 5,0xd0);
  pvVar23 = local_48;
  *(undefined4 *)((long)hal + 0x7dc) = 0;
  ((RK_S32 *)((long)hal + 0x7e0))[0] = 0;
  ((RK_S32 *)((long)hal + 0x7e0))[1] = 0;
  ((RK_S32 *)((long)hal + 0x7e8))[0] = 0;
  ((RK_S32 *)((long)hal + 0x7e8))[1] = 0;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    lVar37 = 0;
    do {
      *(undefined1 *)((long)hal + lVar37 + 0x7e0) = *(undefined1 *)(lVar41 + 0x198 + lVar37 * 4);
      *(byte *)((long)hal + lVar37 + 0x7f0) = *(byte *)(lVar41 + 0x218 + lVar37 * 4) & 0x3f;
      lVar37 = lVar37 + 1;
    } while (lVar37 != 0x10);
  }
  else {
    lVar37 = 0;
    do {
      *(undefined1 *)((long)hal + lVar37 + 0x7e0) = *(undefined1 *)(lVar41 + 0x1d8 + lVar37 * 4);
      *(byte *)((long)hal + lVar37 + 0x7f0) = *(byte *)(lVar41 + 600 + lVar37 * 4) & 0x3f;
      lVar37 = lVar37 + 1;
    } while (lVar37 != 0x10);
  }
  *(ulong *)((long)hal + 0x800) =
       *(ulong *)((long)hal + 0x800) & 0xf000f000f000003f | (ulong)DAT_002acc20;
  *(uint *)((long)hal + 0x808) = *(uint *)((long)hal + 0x808) & 0xfffff000 | 0x31;
  mpp_env_get_u32("dump_l2_reg",&dump_l2_reg,0);
  if (dump_l2_reg != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","L2 reg dump start:\n",(char *)0x0);
    lVar41 = -0x30c;
    do {
      _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,(ulong)((int)lVar41 + 0x310),
                 (ulong)*(uint *)((long)hal + lVar41 + 0x80c));
      lVar41 = lVar41 + 4;
    } while (lVar41 != 0);
    _mpp_log_l(4,"hal_h264e_vepu541","L2 reg done\n",(char *)0x0);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_l2");
  }
  mpp_env_get_u32("dump_l1_reg",&dump_l1_reg,0);
  if (dump_l1_reg != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","L1 reg dump start:\n",(char *)0x0);
    uVar32 = 0;
    do {
      _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,uVar32 & 0xffffffff,
                 (ulong)*(uint *)((long)pvVar23 + uVar32));
      uVar32 = uVar32 + 4;
    } while (uVar32 != 0x1d0);
    _mpp_log_l(4,"hal_h264e_vepu541","L1 reg done\n",(char *)0x0);
  }
  *(int *)((long)hal + 0x14) = *(int *)((long)hal + 0x14) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu541_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    Vepu541H264eRegSet *regs = &ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu541_normal(regs, ctx->is_vepu540);
    ret = setup_vepu541_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu541_codec(regs, sps, pps, slice);
    setup_vepu541_rdo_pred(regs, sps, pps, slice, cfg);
    setup_vepu541_rc_base(regs, sps, slice, &cfg->hw, task->rc_task);
    setup_vepu541_io_buf(regs, ctx->dev, task);
    setup_vepu541_roi(regs, ctx);
    setup_vepu541_recn_refr(regs, ctx->dev, ctx->frms, ctx->hw_recn,
                            ctx->pixel_buf_fbc_hdr_size);

    regs->reg082.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;

    regs->reg068.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg068.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu541_split(regs, &cfg->split);
    if (ctx->is_vepu540 && prep->width > 1920)
        setup_vepu540_force_slice_split(regs, prep->width);

    setup_vepu541_me(regs, sps, slice, ctx->is_vepu540);

    if (frm_status->is_i_refresh)
        setup_vepu541_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (ctx->is_vepu540)
        vepu540_set_osd(&ctx->osd_cfg);
    else
        vepu541_set_osd(&ctx->osd_cfg);

    setup_vepu541_l2(&ctx->regs_l2_set, slice, &cfg->hw, cfg);

    mpp_env_get_u32("dump_l1_reg", &dump_l1_reg, 0);

    if (dump_l1_reg) {
        mpp_log("L1 reg dump start:\n");
        RK_U32 *p = (RK_U32 *)regs;
        RK_S32 n = 0x1D0 / sizeof(RK_U32);
        RK_S32 i;

        for (i = 0; i < n; i++)
            mpp_log("%04x %08x\n", i * 4, p[i]);

        mpp_log("L1 reg done\n");
    }

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}